

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::getPartials
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,int cumulativeScaleIndex,
          double *outPartials)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  double *pdVar11;
  long lVar12;
  double dVar13;
  
  iVar6 = -5;
  if ((-1 < bufferIndex) && (iVar6 = -5, bufferIndex < *(int *)&(this->super_BeagleImpl).field_0xc))
  {
    iVar6 = this->kPaddedPatternCount;
    uVar8 = this->kStateCount;
    iVar1 = this->kPatternCount;
    uVar2 = this->kPartialsPaddedStateCount;
    if (uVar8 == uVar2 && iVar6 == iVar1) {
      uVar8 = this->kPartialsSize;
      if ((ulong)uVar8 != 0) {
        pdVar7 = this->gPartials[(uint)bufferIndex];
        uVar9 = 0;
        do {
          outPartials[uVar9] = pdVar7[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
    }
    else {
      iVar3 = this->kCategoryCount;
      if (uVar8 == uVar2) {
        if (0 < iVar3) {
          iVar10 = 0;
          pdVar7 = this->gPartials[(uint)bufferIndex];
          uVar8 = uVar2 * iVar1;
          pdVar11 = outPartials;
          do {
            if ((ulong)uVar8 != 0) {
              uVar9 = 0;
              do {
                pdVar11[uVar9] = pdVar7[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
            }
            iVar10 = iVar10 + 1;
            pdVar11 = pdVar11 + (int)uVar8;
            pdVar7 = pdVar7 + (int)(iVar6 * uVar2);
          } while (iVar10 != iVar3);
        }
      }
      else if (0 < iVar3) {
        iVar10 = 0;
        pdVar7 = this->gPartials[(uint)bufferIndex];
        pdVar11 = outPartials;
        do {
          if (0 < iVar1) {
            iVar5 = 0;
            do {
              if ((ulong)uVar8 != 0) {
                uVar9 = 0;
                do {
                  pdVar11[uVar9] = pdVar7[uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar8 != uVar9);
              }
              pdVar11 = pdVar11 + (int)uVar8;
              pdVar7 = pdVar7 + (int)uVar2;
              iVar5 = iVar5 + 1;
            } while (iVar5 != iVar1);
          }
          pdVar7 = pdVar7 + (int)((iVar6 - iVar1) * uVar2);
          iVar10 = iVar10 + 1;
        } while (iVar10 != iVar3);
      }
    }
    iVar6 = 0;
    if ((cumulativeScaleIndex != -1) && (0 < iVar1)) {
      lVar12 = 0;
      iVar6 = 0;
      pdVar7 = this->gScaleBuffers[cumulativeScaleIndex];
      do {
        dVar13 = exp(pdVar7[lVar12]);
        iVar1 = this->kStateCount;
        if (0 < iVar1) {
          lVar4 = 0;
          do {
            outPartials[iVar6 + lVar4] = dVar13 * outPartials[iVar6 + lVar4];
            lVar4 = lVar4 + 1;
          } while (iVar1 != (int)lVar4);
          iVar6 = iVar6 + (int)lVar4;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < this->kPatternCount);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getPartials(int bufferIndex,
                               int cumulativeScaleIndex,
                               double* outPartials) {

    // TODO: Test with and without padding
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;

    if ((kPatternCount == kPaddedPatternCount) && (kStateCount == kPartialsPaddedStateCount)) {
        beagleMemCpy(outPartials, gPartials[bufferIndex], kPartialsSize);
    } else if (kStateCount == kPartialsPaddedStateCount) {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kPatternCount * kStateCount);
            offsetOutPartials += kPatternCount * kStateCount;
            offsetBeaglePartials += kPaddedPatternCount * kStateCount;
        }
    } else {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kStateCount);
                offsetOutPartials += kStateCount;
                offsetBeaglePartials += kPartialsPaddedStateCount;
            }
            offsetBeaglePartials += (kPaddedPatternCount - kPatternCount) * kPartialsPaddedStateCount;
        }
    }

    if (cumulativeScaleIndex != BEAGLE_OP_NONE) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
        int index = 0;
        for(int k=0; k<kPatternCount; k++) {
            REALTYPE scaleFactor = exp(cumulativeScaleBuffer[k]);
            for(int i=0; i<kStateCount; i++) {
                outPartials[index] *= scaleFactor;
                index++;
            }
        }
        // TODO: Do we assume the cumulativeScaleBuffer is on the log-scale?
    }

    return BEAGLE_SUCCESS;
}